

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

ImageChannelDesc * __thiscall
pbrt::Image::GetChannelDesc
          (ImageChannelDesc *__return_storage_ptr__,Image *this,
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          requestedChannels)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_t sVar2;
  size_t __n;
  int iVar3;
  memory_resource *pmVar4;
  size_type n;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar5;
  size_t sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  size_type *psVar8;
  size_type sVar9;
  ImageChannelDesc desc;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> local_60;
  
  n = requestedChannels.n;
  local_60.alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_60.ptr = (int *)0x0;
  local_60.nAlloc = 0;
  local_60.nStored = 0;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::resize(&local_60,n);
  if (n != 0) {
    pbVar1 = (this->channelNames).ptr;
    sVar2 = (this->channelNames).nStored;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->channelNames).field_2;
    if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar7 = pbVar1;
    }
    paVar5 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
              *)local_60.ptr;
    if ((anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
         *)local_60.ptr ==
        (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
         *)0x0) {
      paVar5 = &local_60.field_2;
    }
    sVar9 = 0;
    do {
      if (sVar2 == 0) {
        sVar6 = 0;
      }
      else {
        sVar6 = 0;
        __n = requestedChannels.ptr[sVar9]._M_string_length;
        psVar8 = &pbVar7->_M_string_length;
        while ((__n != *psVar8 ||
               ((__n != 0 &&
                (iVar3 = bcmp(requestedChannels.ptr[sVar9]._M_dataplus._M_p,
                              (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(psVar8 + -1))->_M_dataplus)._M_p,__n), iVar3 != 0))))) {
          sVar6 = sVar6 + 1;
          psVar8 = psVar8 + 4;
          if (sVar2 == sVar6) goto LAB_002d6aff;
        }
        paVar5->fixed[sVar9] = (int)sVar6;
      }
      if (sVar6 == sVar2) {
LAB_002d6aff:
        pmVar4 = pstd::pmr::new_delete_resource();
        (__return_storage_ptr__->offset).alloc.memoryResource = pmVar4;
        (__return_storage_ptr__->offset).ptr = (int *)0x0;
        (__return_storage_ptr__->offset).nAlloc = 0;
        (__return_storage_ptr__->offset).nStored = 0;
        goto LAB_002d6b1c;
      }
      sVar9 = sVar9 + 1;
    } while (sVar9 != n);
  }
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::InlinedVector
            (&__return_storage_ptr__->offset,&local_60);
LAB_002d6b1c:
  local_60.nStored = 0;
  (*(local_60.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_60.alloc.memoryResource,local_60.ptr,local_60.nAlloc << 2,4);
  return __return_storage_ptr__;
}

Assistant:

ImageChannelDesc Image::GetChannelDesc(
    pstd::span<const std::string> requestedChannels) const {
    ImageChannelDesc desc;
    desc.offset.resize(requestedChannels.size());
    for (size_t i = 0; i < requestedChannels.size(); ++i) {
        size_t j;
        for (j = 0; j < channelNames.size(); ++j)
            if (requestedChannels[i] == channelNames[j]) {
                desc.offset[i] = j;
                break;
            }
        if (j == channelNames.size())
            return {};
    }

    return desc;
}